

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int unqlite_context_random_string(unqlite_context *pCtx,char *zBuf,int nBuflen)

{
  int iVar1;
  int nBuflen_local;
  char *zBuf_local;
  unqlite_context *pCtx_local;
  
  iVar1 = jx9_context_random_string(pCtx,zBuf,nBuflen);
  return iVar1;
}

Assistant:

int unqlite_context_random_string(unqlite_context *pCtx, char *zBuf, int nBuflen)
{
	return jx9_context_random_string(pCtx,zBuf,nBuflen);
}